

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.c
# Opt level: O0

int main(int argc,char **argv)

{
  char local_f8 [8];
  char error_buf [200];
  char *local_28;
  char *end;
  long val;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_28 = argv[1];
  val = (long)argv;
  argv_local._0_4_ = argc;
  if (argc == 2) {
    end = (char *)strtol(argv[1],&local_28,10);
    if ((*local_28 == '\0') ||
       (end = (char *)strtol(*(char **)(val + 8),&local_28,0x10), *local_28 == '\0')) {
      if (0 < (long)end) {
        end = (char *)-(long)end;
      }
      if (end != (char *)0x0) {
        mbedtls_strerror((int)end,local_f8,200);
        printf("Last error was: -0x%04x - %s\n\n",(ulong)(uint)-(int)end,local_f8);
      }
      argv_local._4_4_ = (int)end;
    }
    else {
      printf(
            "\n usage: strerror <errorcode>\n\n where <errorcode> can be a decimal or hexadecimal (starts with 0x or -0x)\n"
            );
      argv_local._4_4_ = 0;
    }
  }
  else {
    printf(
          "\n usage: strerror <errorcode>\n\n where <errorcode> can be a decimal or hexadecimal (starts with 0x or -0x)\n"
          );
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    long int val;
    char *end = argv[1];

    if( argc != 2 )
    {
        mbedtls_printf( USAGE );
        return( 0 );
    }

    val = strtol( argv[1], &end, 10 );
    if( *end != '\0' )
    {
        val = strtol( argv[1], &end, 16 );
        if( *end != '\0' )
        {
            mbedtls_printf( USAGE );
            return( 0 );
        }
    }
    if( val > 0 )
        val = -val;

    if( val != 0 )
    {
        char error_buf[200];
        mbedtls_strerror( val, error_buf, 200 );
        mbedtls_printf("Last error was: -0x%04x - %s\n\n", (int) -val, error_buf );
    }

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( val );
}